

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O3

bool __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::ContainsKey(SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,int *key)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  __mutex = (pthread_mutex_t *)
            (this->_mutex).super___shared_ptr<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var2 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var5->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    iVar1 = *key;
    p_Var3 = &p_Var5->_M_header;
    do {
      if (iVar1 <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < iVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && (p_Var4 = p_Var3, iVar1 < (int)p_Var3[1]._M_color))
    {
      p_Var4 = &p_Var5->_M_header;
    }
  }
  pthread_mutex_unlock(__mutex);
  return (_Rb_tree_header *)p_Var4 != p_Var5;
}

Assistant:

virtual bool ContainsKey(const Key_& key) const
    {
        Lock l(*_mutex);
        return _map.find(key) != _map.end();
    }